

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

void page_ref(Page *pPage)

{
  SyMemBackend *pSVar1;
  SyMutexMethods *pSVar2;
  SyMutex *pSVar3;
  
  pSVar1 = pPage->pPager->pAllocator;
  pSVar2 = pSVar1->pMutexMethods;
  if ((pSVar2 != (SyMutexMethods *)0x0) && (pSVar3 = pSVar1->pMutex, pSVar3 != (SyMutex *)0x0)) {
    (*pSVar2->xEnter)(pSVar3);
  }
  pPage->nRef = pPage->nRef + 1;
  pSVar1 = pPage->pPager->pAllocator;
  pSVar2 = pSVar1->pMutexMethods;
  if ((pSVar2 != (SyMutexMethods *)0x0) && (pSVar3 = pSVar1->pMutex, pSVar3 != (SyMutex *)0x0)) {
    (*pSVar2->xLeave)(pSVar3);
    return;
  }
  return;
}

Assistant:

static void page_ref(Page *pPage)
{
	if( pPage->pPager->pAllocator->pMutexMethods ){
		SyMutexEnter(pPage->pPager->pAllocator->pMutexMethods, pPage->pPager->pAllocator->pMutex);
	}
	pPage->nRef++;
	if( pPage->pPager->pAllocator->pMutexMethods ){
		SyMutexLeave(pPage->pPager->pAllocator->pMutexMethods, pPage->pPager->pAllocator->pMutex);
	}
}